

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall t_dart_generator::generate_enum(t_dart_generator *this,t_enum *tenum)

{
  int *piVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  int __oflag;
  char *pcVar4;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> *out;
  _Alloc_hider _Var5;
  string class_name;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string file_name;
  string f_enum_name;
  ofstream_with_content_based_conditional_update f_enum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> local_1d0;
  t_dart_generator *this_00;
  
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  this_00 = (t_dart_generator *)CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::string((string *)&local_1f0,(string *)this_00);
  get_file_name(&local_2d0,this_00,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::operator+(&local_310,&this->src_dir_,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                 &local_310,&local_2d0);
  std::operator+(&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                 ".dart");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_310);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&local_1d0);
  std::__cxx11::string::string
            ((string *)&local_310,local_210._M_dataplus._M_p,(allocator *)&local_2f0);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&local_1d0,(char *)&local_310,__oflag);
  std::__cxx11::string::~string((string *)&local_310);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_310,this);
  poVar3 = std::operator<<((ostream *)&local_1d0,(string *)&local_310);
  std::__cxx11::string::string((string *)&local_230,(string *)&local_2d0);
  dart_library(&local_2f0,this,&local_230);
  poVar3 = std::operator<<(poVar3,(string *)&local_2f0);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_310);
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  std::__cxx11::string::string((string *)&local_310,(string *)CONCAT44(extraout_var_00,iVar2));
  std::__cxx11::string::string((string *)&local_250,(string *)&local_2d0);
  std::__cxx11::string::string((string *)&local_270,(string *)&local_310);
  export_class_to_library(this,&local_250,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  poVar3 = std::operator<<((ostream *)&local_1d0,"class ");
  std::operator<<(poVar3,(string *)&local_310);
  std::__cxx11::string::string((string *)&local_290," ",(allocator *)&local_2f0);
  scope_up(this,(ostream *)&local_1d0,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&local_2f0,
             &tenum->constants_);
  for (_Var5._M_p = local_2f0._M_dataplus._M_p; _Var5._M_p != (pointer)local_2f0._M_string_length;
      _Var5._M_p = _Var5._M_p + 8) {
    iVar2 = *(int *)(*(long *)_Var5._M_p + 0x80);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)&local_1d0);
    poVar3 = std::operator<<(poVar3,"static const int ");
    poVar3 = std::operator<<(poVar3,(string *)(*(long *)_Var5._M_p + 0x60));
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,";");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  std::operator<<((ostream *)&local_1d0,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)&local_1d0);
  poVar3 = std::operator<<(poVar3,"static final Set<int> VALID_VALUES = new Set.from([");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pcVar4 = "";
  for (_Var5._M_p = local_2f0._M_dataplus._M_p; _Var5._M_p != (pointer)local_2f0._M_string_length;
      _Var5._M_p = _Var5._M_p + 8) {
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)&local_1d0);
    std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<((ostream *)&local_1d0,(string *)(*(long *)_Var5._M_p + 0x60));
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    pcVar4 = ", ";
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)&local_1d0);
  poVar3 = std::operator<<(poVar3,"]);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)&local_1d0);
  poVar3 = std::operator<<(poVar3,"static final Map<int, String> VALUES_TO_NAMES = {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pcVar4 = "";
  for (_Var5._M_p = local_2f0._M_dataplus._M_p; _Var5._M_p != (pointer)local_2f0._M_string_length;
      _Var5._M_p = _Var5._M_p + 8) {
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)&local_1d0);
    std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<((ostream *)&local_1d0,(string *)(*(long *)_Var5._M_p + 0x60));
    poVar3 = std::operator<<(poVar3,": \'");
    poVar3 = std::operator<<(poVar3,(string *)(*(long *)_Var5._M_p + 0x60));
    poVar3 = std::operator<<(poVar3,"\'");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    pcVar4 = ", ";
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)&local_1d0);
  poVar3 = std::operator<<(poVar3,"};");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_2b0,(string *)&::endl_abi_cxx11_);
  out = &local_1d0;
  scope_down(this,(ostream *)out,&local_2b0);
  iVar2 = (int)out;
  std::__cxx11::string::~string((string *)&local_2b0);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&local_1d0,iVar2);
  std::_Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~_Vector_base
            ((_Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&local_1d0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_2d0);
  return;
}

Assistant:

void t_dart_generator::generate_enum(t_enum* tenum) {
  // Make output file
  string file_name = get_file_name(tenum->get_name());

  string f_enum_name = src_dir_ + "/" + file_name + ".dart";
  ofstream_with_content_based_conditional_update f_enum;
  f_enum.open(f_enum_name.c_str());

  // Comment and add library
  f_enum << autogen_comment() << dart_library(file_name) << endl;

  string class_name = tenum->get_name();
  export_class_to_library(file_name, class_name);
  f_enum << "class " << class_name;
  scope_up(f_enum);

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    int value = (*c_iter)->get_value();
    indent(f_enum) << "static const int " << (*c_iter)->get_name() << " = " << value << ";"
                   << endl;
  }

  // Create a static Set with all valid values for this enum
  f_enum << endl;

  indent(f_enum) << "static final Set<int> VALID_VALUES = new Set.from([" << endl;
  indent_up();
  bool firstValue = true;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    // populate set
    indent(f_enum) << (firstValue ? "" : ", ");
    f_enum << (*c_iter)->get_name() << endl;
    firstValue = false;
  }
  indent_down();
  indent(f_enum) << "]);" << endl;

  indent(f_enum) << "static final Map<int, String> VALUES_TO_NAMES = {" << endl;
  indent_up();
  firstValue = true;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    indent(f_enum) << (firstValue ? "" : ", ");
    f_enum  << (*c_iter)->get_name() << ": '" << (*c_iter)->get_name() << "'" << endl;
    firstValue = false;
  }
  indent_down();
  indent(f_enum) << "};" << endl;

  scope_down(f_enum); // end class

  f_enum.close();
}